

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(string *platform)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_7d;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  string local_38 [32];
  
  if (PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
      supportedPlatforms_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                                 supportedPlatforms_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Windows",&local_79);
      std::__cxx11::string::string<std::allocator<char>>(local_58,"Linux",&local_7a);
      std::__cxx11::string::string<std::allocator<char>>(local_38,"Darwin",&local_7b);
      __l._M_len = 3;
      __l._M_array = &local_78;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
             supportedPlatforms_abi_cxx11_,__l,&local_7c,&local_7d);
      lVar3 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_78._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x20);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                           supportedPlatforms_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                           supportedPlatforms_abi_cxx11_);
    }
  }
  sVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                   supportedPlatforms_abi_cxx11_,platform);
  return sVar2 != 0;
}

Assistant:

bool cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
  const std::string& platform)
{
  static const std::set<std::string> supportedPlatforms = { "Windows", "Linux",
                                                            "Darwin" };
  return supportedPlatforms.count(platform);
}